

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O1

void brotli::InitialEntropyCodes<brotli::Histogram<704>,unsigned_short>
               (unsigned_short *data,size_t length,size_t literals_per_histogram,
               size_t max_histograms,size_t stride,
               vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> *vec)

{
  pointer *ppHVar1;
  iterator __position;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  size_t i;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  Histogram<704> histo;
  Histogram<704> local_b40;
  
  uVar5 = 0;
  uVar4 = length / literals_per_histogram + 1;
  if (max_histograms <= uVar4) {
    uVar4 = max_histograms;
  }
  uVar6 = 7;
  do {
    uVar2 = (uVar5 * length) / uVar4;
    if (uVar5 != 0) {
      bVar7 = uVar6 == 0;
      uVar6 = uVar6 * 0x41a7;
      if (bVar7) {
        uVar6 = 1;
      }
      uVar2 = uVar2 + (ulong)uVar6 % (length / uVar4);
    }
    memset(&local_b40,0,0xb08);
    local_b40.total_count_ = local_b40.total_count_ + stride;
    local_b40.bit_cost_ = INFINITY;
    if (stride != 0) {
      if (length <= stride + uVar2) {
        uVar2 = ~stride + length;
      }
      sVar3 = 0;
      do {
        local_b40.data_[data[uVar2 + sVar3]] = local_b40.data_[data[uVar2 + sVar3]] + 1;
        sVar3 = sVar3 + 1;
      } while (stride != sVar3);
    }
    __position._M_current =
         (vec->super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (vec->super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<brotli::Histogram<704>,std::allocator<brotli::Histogram<704>>>::
      _M_realloc_insert<brotli::Histogram<704>const&>
                ((vector<brotli::Histogram<704>,std::allocator<brotli::Histogram<704>>> *)vec,
                 __position,&local_b40);
    }
    else {
      memcpy(__position._M_current,&local_b40,0xb10);
      ppHVar1 = &(vec->
                 super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppHVar1 = *ppHVar1 + 1;
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 < uVar4);
  return;
}

Assistant:

void InitialEntropyCodes(const DataType* data, size_t length,
                         size_t literals_per_histogram,
                         size_t max_histograms,
                         size_t stride,
                         std::vector<HistogramType>* vec) {
  size_t total_histograms = length / literals_per_histogram + 1;
  if (total_histograms > max_histograms) {
    total_histograms = max_histograms;
  }
  unsigned int seed = 7;
  size_t block_length = length / total_histograms;
  for (size_t i = 0; i < total_histograms; ++i) {
    size_t pos = length * i / total_histograms;
    if (i != 0) {
      pos += MyRand(&seed) % block_length;
    }
    if (pos + stride >= length) {
      pos = length - stride - 1;
    }
    HistogramType histo;
    histo.Add(data + pos, stride);
    vec->push_back(histo);
  }
}